

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.cpp
# Opt level: O0

void polyscope::error(string *message)

{
  ostream *poVar1;
  logic_error *this;
  _Bind<void_(*(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool))(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool)>
  *in_RDI;
  type func;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  _func_void_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_bool
  *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffffcf;
  function<void_()> *in_stack_ffffffffffffffd0;
  string local_28 [40];
  
  if (0 < options::verbosity) {
    poVar1 = std::operator<<((ostream *)&std::cout,(string *)options::printPrefix_abi_cxx11_);
    poVar1 = std::operator<<(poVar1,"[ERROR] ");
    poVar1 = std::operator<<(poVar1,(string *)in_RDI);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  if ((options::errorsThrowExceptions & 1) != 0) {
    this = (logic_error *)__cxa_allocate_exception(0x10);
    std::operator+(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    std::logic_error::logic_error(this,local_28);
    __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  std::bind<void(&)(std::__cxx11::string,bool),std::__cxx11::string&,bool>
            (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,(bool *)in_RDI);
  (**(code **)(*render::engine + 0x78))();
  std::function<void()>::
  function<std::_Bind<void(*(std::__cxx11::string,bool))(std::__cxx11::string,bool)>&,void>
            ((function<void_()> *)in_stack_ffffffffffffff70,in_RDI);
  pushContext(in_stack_ffffffffffffffd0,(bool)in_stack_ffffffffffffffcf);
  std::function<void_()>::~function((function<void_()> *)0x35f804);
  std::
  _Bind<void_(*(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool))(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool)>
  ::~_Bind((_Bind<void_(*(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool))(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool)>
            *)0x35f80e);
  return;
}

Assistant:

void error(std::string message) {
  if (options::verbosity > 0) {
    std::cout << options::printPrefix << "[ERROR] " << message << std::endl;
  }

  if (options::errorsThrowExceptions) {
    throw std::logic_error(options::printPrefix + message);
  }

  auto func = std::bind(buildErrorUI, message, false);
  
  render::engine->showWindow();
  pushContext(func, false);
}